

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ConcatenationExpression::fromEmpty
          (Compilation *compilation,EmptyQueueExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  Type *pTVar1;
  Type *this;
  EmptyQueueExpressionSyntax *this_00;
  bool bVar2;
  bitwidth_t arg;
  Expression *pEVar3;
  Diagnostic *pDVar4;
  ConcatenationExpression *pCVar5;
  SourceRange local_a0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_90;
  ConstantRange local_80;
  SourceRange local_78;
  DiagCode local_64;
  SourceRange local_60;
  DiagCode local_4c;
  SourceRange local_48;
  DiagCode local_34;
  Type *local_30;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  EmptyQueueExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  local_30 = assignmentTarget;
  assignmentTarget_local = (Type *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (EmptyQueueExpressionSyntax *)compilation;
  if ((assignmentTarget == (Type *)0x0) || (bVar2 = Type::isUnpackedArray(assignmentTarget), !bVar2)
     ) {
    pTVar1 = assignmentTarget_local;
    local_34.subsystem = Expressions;
    local_34.code = 0x44;
    local_48 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    ASTContext::addDiag((ASTContext *)pTVar1,local_34,local_48);
    pEVar3 = Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
    return pEVar3;
  }
  bVar2 = Type::isAssociativeArray(local_30);
  pTVar1 = assignmentTarget_local;
  if (bVar2) {
    local_4c.subsystem = Expressions;
    local_4c.code = 0x93;
    local_60 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    ASTContext::addDiag((ASTContext *)pTVar1,local_4c,local_60);
    pEVar3 = Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
    return pEVar3;
  }
  bVar2 = Type::hasFixedRange(local_30);
  this_00 = syntax_local;
  this = assignmentTarget_local;
  pTVar1 = local_30;
  if (!bVar2) {
    nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
    span<true,_0>(&local_90);
    local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    pCVar5 = BumpAllocator::
             emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                       ((BumpAllocator *)this_00,pTVar1,&local_90,&local_a0);
    return &pCVar5->super_Expression;
  }
  local_64.subsystem = Expressions;
  local_64.code = 0x94;
  local_78 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  pDVar4 = ASTContext::addDiag((ASTContext *)this,local_64,local_78);
  pDVar4 = ast::operator<<(pDVar4,local_30);
  local_80 = Type::getFixedRange(local_30);
  arg = ConstantRange::width(&local_80);
  pDVar4 = Diagnostic::operator<<(pDVar4,arg);
  Diagnostic::operator<<(pDVar4,0);
  pEVar3 = Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
  return pEVar3;
}

Assistant:

Expression& ConcatenationExpression::fromEmpty(Compilation& compilation,
                                               const EmptyQueueExpressionSyntax& syntax,
                                               const ASTContext& context,
                                               const Type* assignmentTarget) {
    // Empty concatenation can only target arrays.
    if (!assignmentTarget || !assignmentTarget->isUnpackedArray()) {
        context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->isAssociativeArray()) {
        context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->hasFixedRange()) {
        context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
            << *assignmentTarget << assignmentTarget->getFixedRange().width() << 0;
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<ConcatenationExpression>(*assignmentTarget,
                                                         span<const Expression* const>{},
                                                         syntax.sourceRange());
}